

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window,ImGuiFocusRequestFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  bool restore_focus_to_window_under_popup;
  bool restore_focus_to_window_under_popup_00;
  bool restore_focus_to_window_under_popup_01;
  char *pcVar4;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  if (((flags & 2U) != 0) && (GImGui->NavWindow != window)) {
    pIVar3 = FindBlockingModal(window);
    if (pIVar3 != (ImGuiWindow *)0x0) {
      if ((pIVar2->DebugLogFlags & 2) != 0) {
        if (window == (ImGuiWindow *)0x0) {
          pcVar4 = "<NULL>";
        }
        else {
          pcVar4 = window->Name;
        }
        DebugLog("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n",pcVar4,
                 pIVar3->Name);
      }
      if (((window != (ImGuiWindow *)0x0) && (window->RootWindow == window)) &&
         ((window->Flags & 0x2000) == 0)) {
        BringWindowToDisplayBehind(window,pIVar3);
      }
      pIVar3 = GetTopMostPopupModal();
      ClosePopupsOverWindow
                ((ImGui *)pIVar3,(ImGuiWindow *)0x0,restore_focus_to_window_under_popup_01);
      return;
    }
  }
  if (((window == (ImGuiWindow *)0x0 || (flags & 1U) == 0) ||
      (pIVar3 = window->NavLastChildNavWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
     (pIVar3->WasActive == false)) {
    pIVar3 = window;
  }
  if (pIVar2->NavWindow == pIVar3) {
    if (pIVar3 == (ImGuiWindow *)0x0) {
      bVar1 = true;
      window_00 = (ImGuiWindow *)0x0;
      goto LAB_0017c4a6;
    }
  }
  else {
    SetNavWindow(pIVar3);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      window_00 = (ImGuiWindow *)0x0;
      pIVar2->NavId = 0;
      pIVar2->NavLayer = ImGuiNavLayer_Main;
      SetNavFocusScope(0);
      pIVar2->NavIdIsAlive = false;
      pIVar2->NavLastValidSelectionUserData = -1;
      ClosePopupsOverWindow((ImGui *)0x0,(ImGuiWindow *)0x0,restore_focus_to_window_under_popup_00);
      bVar1 = true;
      goto LAB_0017c4a6;
    }
    if (pIVar2->NavDisableMouseHover == true) {
      pIVar2->NavMousePosDirty = true;
    }
    pIVar2->NavId = pIVar3->NavLastIds[0];
    pIVar2->NavLayer = ImGuiNavLayer_Main;
    SetNavFocusScope(pIVar3->NavRootFocusScopeId);
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLastValidSelectionUserData = -1;
    ClosePopupsOverWindow((ImGui *)pIVar3,(ImGuiWindow *)0x0,restore_focus_to_window_under_popup);
  }
  window_00 = pIVar3->RootWindow;
  bVar1 = false;
LAB_0017c4a6:
  if (((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar2->ActiveIdWindow->RootWindow != window_00 &&
      (pIVar2->ActiveIdNoClearOnFocusLoss == false)))) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  if (!bVar1) {
    BringWindowToFocusFront(window_00);
    if (((uint)(window_00->Flags | pIVar3->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window, ImGuiFocusRequestFlags flags)
{
    ImGuiContext& g = *GImGui;

    // Modal check?
    if ((flags & ImGuiFocusRequestFlags_UnlessBelowModal) && (g.NavWindow != window)) // Early out in common case.
        if (ImGuiWindow* blocking_modal = FindBlockingModal(window))
        {
            // This block would typically be reached in two situations:
            // - API call to FocusWindow() with a window under a modal and ImGuiFocusRequestFlags_UnlessBelowModal flag.
            // - User clicking on void or anything behind a modal while a modal is open (window == NULL)
            IMGUI_DEBUG_LOG_FOCUS("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n", window ? window->Name : "<NULL>", blocking_modal->Name);
            if (window && window == window->RootWindow && (window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
                BringWindowToDisplayBehind(window, blocking_modal); // Still bring right under modal. (FIXME: Could move in focus list too?)
            ClosePopupsOverWindow(GetTopMostPopupModal(), false); // Note how we need to use GetTopMostPopupModal() aad NOT blocking_modal, to handle nested modals
            return;
        }

    // Find last focused child (if any) and focus it instead.
    if ((flags & ImGuiFocusRequestFlags_RestoreFocusedChild) && window != NULL)
        window = NavRestoreLastChildNavWindow(window);

    // Apply focus
    if (g.NavWindow != window)
    {
        SetNavWindow(window);
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavLayer = ImGuiNavLayer_Main;
        SetNavFocusScope(window ? window->NavRootFocusScopeId : 0);
        g.NavIdIsAlive = false;
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;

        // Close popups if any
        ClosePopupsOverWindow(window, false);
    }

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}